

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::PopulateCustomVectors(cmCTestBuildHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  string *psVar4;
  string_view sVar5;
  allocator<char> local_1d1;
  string local_1d0;
  cmValue local_1b0;
  cmValue customWarningExceptions;
  allocator<char> local_191;
  string local_190;
  cmValue local_170;
  cmValue customWarningMatchers;
  string local_160;
  allocator<char> local_139;
  string local_138;
  int local_118;
  allocator<char> local_111;
  int n;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmCTestBuildHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_CUSTOM_ERROR_MATCH",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomErrorMatches);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CTEST_CUSTOM_ERROR_EXCEPTION",&local_71);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_70,&this->CustomErrorExceptions);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CTEST_CUSTOM_WARNING_MATCH",&local_99);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_98,&this->CustomWarningMatches);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CTEST_CUSTOM_WARNING_EXCEPTION",&local_c1);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_c0,&this->CustomWarningExceptions);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CTEST_CUSTOM_MAXIMUM_NUMBER_OF_ERRORS",&local_e9);
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_e8,&this->MaxErrors);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&n,"CTEST_CUSTOM_MAXIMUM_NUMBER_OF_WARNINGS",&local_111);
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,(string *)&n,&this->MaxWarnings);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator(&local_111);
  pcVar2 = local_18;
  local_118 = -1;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"CTEST_CUSTOM_ERROR_PRE_CONTEXT",&local_139);
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_138,&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pcVar2 = local_18;
  if (local_118 != -1) {
    this->MaxPreContext = (long)local_118;
  }
  local_118 = -1;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"CTEST_CUSTOM_ERROR_POST_CONTEXT",
             (allocator<char> *)((long)&customWarningMatchers.Value + 7));
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_160,&local_118);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&customWarningMatchers.Value + 7));
  pcVar2 = local_18;
  if (local_118 != -1) {
    this->MaxPostContext = (long)local_118;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CTEST_CUSTOM_WARNING_MATCH",&local_191);
  local_170 = cmMakefile::GetDefinition(pcVar2,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  bVar3 = cmValue::operator_cast_to_bool(&local_170);
  if (bVar3) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_170);
    sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    customWarningExceptions.Value = (string *)sVar5._M_len;
    cmExpandList(sVar5,&this->ReallyCustomWarningMatches,false);
  }
  pcVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"CTEST_CUSTOM_WARNING_EXCEPTION",&local_1d1);
  local_1b0 = cmMakefile::GetDefinition(pcVar2,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar3 = cmValue::operator_cast_to_bool(&local_1b0);
  if (bVar3) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_1b0);
    sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    cmExpandList(sVar5,&this->ReallyCustomWarningExceptions,false);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_ERROR_MATCH",
                                    this->CustomErrorMatches);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_ERROR_EXCEPTION",
                                    this->CustomErrorExceptions);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_WARNING_MATCH",
                                    this->CustomWarningMatches);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_WARNING_EXCEPTION",
                                    this->CustomWarningExceptions);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_NUMBER_OF_ERRORS", this->MaxErrors);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_NUMBER_OF_WARNINGS", this->MaxWarnings);

  int n = -1;
  this->CTest->PopulateCustomInteger(mf, "CTEST_CUSTOM_ERROR_PRE_CONTEXT", n);
  if (n != -1) {
    this->MaxPreContext = static_cast<size_t>(n);
  }

  n = -1;
  this->CTest->PopulateCustomInteger(mf, "CTEST_CUSTOM_ERROR_POST_CONTEXT", n);
  if (n != -1) {
    this->MaxPostContext = static_cast<size_t>(n);
  }

  // Record the user-specified custom warning rules.
  if (cmValue customWarningMatchers =
        mf->GetDefinition("CTEST_CUSTOM_WARNING_MATCH")) {
    cmExpandList(*customWarningMatchers, this->ReallyCustomWarningMatches);
  }
  if (cmValue customWarningExceptions =
        mf->GetDefinition("CTEST_CUSTOM_WARNING_EXCEPTION")) {
    cmExpandList(*customWarningExceptions,
                 this->ReallyCustomWarningExceptions);
  }
}